

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_encoder.hpp
# Opt level: O2

void __thiscall duckdb::RleBpEncoder::WriteCurrentBlockRLE(RleBpEncoder *this,WriteStream *writer)

{
  undefined8 *puVar1;
  InternalException *this_00;
  undefined8 uStack_60;
  allocator local_49;
  uint32_t local_48 [8];
  
  ParquetDecodeUtils::VarintEncode<unsigned_long>(this->rle_count * 2,writer);
  switch(this->byte_width) {
  case 1:
    local_48[0] = CONCAT31(local_48[0]._1_3_,(char)this->rle_value);
    puVar1 = *(undefined8 **)writer;
    uStack_60 = 1;
    break;
  case 2:
    local_48[0] = CONCAT22(local_48[0]._2_2_,(short)this->rle_value);
    puVar1 = *(undefined8 **)writer;
    uStack_60 = 2;
    break;
  case 3:
    local_48[0]._0_1_ = *(string *)&this->rle_value;
    uStack_60 = 1;
    (*(code *)**(undefined8 **)writer)(writer,local_48,1);
    local_48[0]._0_1_ = *(string *)((long)&this->rle_value + 1);
    (*(code *)**(undefined8 **)writer)(writer,local_48,1);
    local_48[0] = CONCAT31(local_48[0]._1_3_,*(undefined1 *)((long)&this->rle_value + 2));
    puVar1 = *(undefined8 **)writer;
    break;
  case 4:
    local_48[0] = this->rle_value;
    puVar1 = *(undefined8 **)writer;
    uStack_60 = 4;
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)local_48,"unsupported byte width for RLE encoding",&local_49);
    duckdb::InternalException::InternalException(this_00,(string *)local_48);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  (*(code *)*puVar1)(writer,local_48,uStack_60);
  this->rle_count = 0;
  return;
}

Assistant:

void WriteCurrentBlockRLE(WriteStream &writer) {
		ParquetDecodeUtils::VarintEncode(rle_count << 1 | 0, writer); // (... | 0) signals RLE run
		D_ASSERT(rle_value >> (byte_width * 8) == 0);
		switch (byte_width) {
		case 1:
			writer.Write<uint8_t>(rle_value);
			break;
		case 2:
			writer.Write<uint16_t>(rle_value);
			break;
		case 3:
			writer.Write<uint8_t>(rle_value & 0xFF);
			writer.Write<uint8_t>((rle_value >> 8) & 0xFF);
			writer.Write<uint8_t>((rle_value >> 16) & 0xFF);
			break;
		case 4:
			writer.Write<uint32_t>(rle_value);
			break;
		default:
			throw InternalException("unsupported byte width for RLE encoding");
		}
		rle_count = 0;
	}